

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShader_gl_in_ArrayContentsTest::deinit(GeometryShader_gl_in_ArrayContentsTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0xd8))(0);
  (**(code **)(lVar2 + 0x48))(0x8c8e,0,0);
  (**(code **)(lVar2 + 0x40))(0x8892,0);
  if (this->m_vertex_array_object_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vertex_array_object_id);
  }
  if (this->m_buffer_object_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_buffer_object_id);
  }
  if (this->m_program_object_sized_arrays_id != 0) {
    (**(code **)(lVar2 + 0x448))();
  }
  if (this->m_program_object_unsized_arrays_id != 0) {
    (**(code **)(lVar2 + 0x448))();
  }
  if (this->m_fragment_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_geometry_shader_sized_arrays_id != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_geometry_shader_unsized_arrays_id != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_vertex_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShader_gl_in_ArrayContentsTest::deinit()
{
	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind default values */
	gl.useProgram(0);
	gl.bindVertexArray(0);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, 0 /* id */);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	/* Delete everything */
	if (0 != m_vertex_array_object_id)
	{
		gl.deleteVertexArrays(1, &m_vertex_array_object_id);
	}

	if (0 != m_buffer_object_id)
	{
		gl.deleteBuffers(1, &m_buffer_object_id);
	}

	if (0 != m_program_object_sized_arrays_id)
	{
		gl.deleteProgram(m_program_object_sized_arrays_id);
	}

	if (0 != m_program_object_unsized_arrays_id)
	{
		gl.deleteProgram(m_program_object_unsized_arrays_id);
	}

	if (0 != m_fragment_shader_id)
	{
		gl.deleteShader(m_fragment_shader_id);
	}

	if (0 != m_geometry_shader_sized_arrays_id)
	{
		gl.deleteShader(m_geometry_shader_sized_arrays_id);
	}

	if (0 != m_geometry_shader_unsized_arrays_id)
	{
		gl.deleteShader(m_geometry_shader_unsized_arrays_id);
	}

	if (0 != m_vertex_shader_id)
	{
		gl.deleteShader(m_vertex_shader_id);
	}

	/* Deinitialize Base */
	TestCaseBase::deinit();
}